

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  char cVar1;
  undefined1 auVar2 [16];
  int iVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  float *pfVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  uchar scanlineheader [4];
  char header [66];
  char buffer [128];
  undefined1 local_1b5;
  undefined4 local_1b4;
  char local_1ad;
  undefined4 local_1ac;
  long local_1a8;
  void *local_1a0;
  void *local_198;
  long local_190;
  ulong local_188;
  ulong local_180;
  uint local_174;
  uint local_170;
  int local_16c;
  uint local_168;
  uint local_164;
  char local_160 [4];
  char local_15c [4];
  long local_158;
  long local_150;
  float *local_148;
  ulong local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  void *local_118;
  long local_110;
  char local_108 [64];
  undefined2 local_c8;
  char local_b8 [136];
  
  iVar3 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    local_148 = data;
    pvVar4 = malloc((ulong)(uint)(x * 4));
    builtin_strncpy(local_108,"#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe",
                    0x40);
    local_c8 = 10;
    (*s->func)(s->context,local_108,0x41);
    iVar3 = sprintf(local_b8,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    (ulong)(uint)x);
    uVar8 = 0;
    (*s->func)(s->context,local_b8,iVar3);
    local_16c = comp * x;
    local_170 = (uint)x >> 8;
    local_174 = x - 0x8000;
    uVar10 = comp - 3;
    local_188 = (ulong)(uint)x;
    local_110 = local_188 - 3;
    local_158 = (long)comp << 2;
    local_130 = -local_188;
    local_128 = (ulong)(uint)(x * 3) + (long)pvVar4;
    local_120 = (ulong)(uint)(x * 2) + (long)pvVar4;
    local_138 = (long)pvVar4 + local_188;
    local_150 = (long)pvVar4 + 2;
    local_180 = (ulong)(uint)x;
    local_168 = y;
    local_164 = uVar10;
    local_118 = pvVar4;
    do {
      uVar7 = ~(uint)uVar8 + local_168;
      if (stbi__flip_vertically_on_write == 0) {
        uVar7 = (uint)uVar8;
      }
      pfVar9 = local_148 + (int)(uVar7 * local_16c);
      local_1ac = CONCAT13((char)local_180,CONCAT12((char)local_170,0x202));
      uVar13 = local_188;
      local_140 = uVar8;
      if (local_174 < 0xffff8008) {
        do {
          if (uVar10 < 2) {
            fVar18 = pfVar9[2];
            auVar19 = ZEXT416((uint)pfVar9[1]);
            auVar20 = ZEXT416((uint)*pfVar9);
          }
          else {
            fVar18 = *pfVar9;
            auVar19 = ZEXT416((uint)fVar18);
            auVar20 = auVar19;
          }
          auVar2 = vmaxss_avx(auVar19,ZEXT416((uint)fVar18));
          auVar2 = vmaxss_avx(auVar20,auVar2);
          fVar21 = auVar2._0_4_;
          if (1e-32 <= fVar21) {
            local_198 = (void *)CONCAT44(local_198._4_4_,fVar18);
            local_1a0 = (void *)CONCAT44(local_1a0._4_4_,auVar19._0_4_);
            local_1a8 = CONCAT44(local_1a8._4_4_,auVar20._0_4_);
            local_190 = CONCAT44(local_190._4_4_,fVar21);
            fVar18 = frexpf(fVar21,(int *)local_160);
            fVar18 = (fVar18 * 256.0) / (float)local_190;
            local_1b4 = CONCAT13(local_160[0] + -0x80,
                                 CONCAT12((char)(int)(fVar18 * local_198._0_4_),
                                          CONCAT11((char)(int)(fVar18 * local_1a0._0_4_),
                                                   (char)(int)(fVar18 * (float)local_1a8))));
          }
          else {
            local_1b4 = 0;
          }
          (*s->func)(s->context,&local_1b4,4);
          pfVar9 = (float *)((long)pfVar9 + local_158);
          uVar13 = uVar13 - 1;
          pvVar12 = pvVar4;
        } while (uVar13 != 0);
      }
      else {
        lVar14 = 0;
        do {
          if (uVar10 < 2) {
            fVar18 = pfVar9[2];
            auVar19 = ZEXT416((uint)pfVar9[1]);
            auVar20 = ZEXT416((uint)*pfVar9);
          }
          else {
            fVar18 = *pfVar9;
            auVar19 = ZEXT416((uint)fVar18);
            auVar20 = auVar19;
          }
          auVar2 = vmaxss_avx(auVar19,ZEXT416((uint)fVar18));
          auVar2 = vmaxss_avx(auVar20,auVar2);
          fVar21 = auVar2._0_4_;
          if (1e-32 <= fVar21) {
            local_198 = (void *)CONCAT44(local_198._4_4_,fVar18);
            local_1a0 = (void *)CONCAT44(local_1a0._4_4_,auVar19._0_4_);
            local_1a8 = CONCAT44(local_1a8._4_4_,auVar20._0_4_);
            local_190 = CONCAT44(local_190._4_4_,fVar21);
            fVar18 = frexpf(fVar21,(int *)local_15c);
            fVar18 = (fVar18 * 256.0) / (float)local_190;
            local_1b4 = CONCAT13(local_15c[0] + -0x80,
                                 CONCAT12((char)(int)(fVar18 * local_198._0_4_),
                                          CONCAT11((char)(int)(fVar18 * local_1a0._0_4_),
                                                   (char)(int)(fVar18 * (float)local_1a8))));
          }
          else {
            local_1b4 = 0;
          }
          *(undefined1 *)((long)pvVar4 + lVar14) = (undefined1)local_1b4;
          *(undefined1 *)(local_138 + lVar14) = local_1b4._1_1_;
          *(undefined1 *)(local_120 + lVar14) = local_1b4._2_1_;
          *(undefined1 *)(local_128 + lVar14) = local_1b4._3_1_;
          lVar14 = lVar14 + 1;
          pfVar9 = (float *)((long)pfVar9 + local_158);
        } while (local_130 + lVar14 != 0);
        (*s->func)(s->context,&local_1ac,4);
        local_1a8 = local_150;
        lVar14 = 0;
        pvVar12 = pvVar4;
        do {
          pvVar12 = (void *)(lVar14 * local_188 + (long)pvVar12);
          iVar3 = 0;
          local_1a0 = pvVar4;
          local_198 = pvVar12;
          local_190 = lVar14;
          do {
            iVar15 = (int)local_180;
            if (iVar3 + 2 < iVar15) {
              lVar5 = (long)iVar3;
              lVar14 = lVar5;
              if (lVar5 < local_110) {
                lVar14 = local_110;
              }
              lVar6 = lVar5 + local_1a8;
              lVar17 = 0;
              do {
                cVar1 = *(char *)(lVar6 + -2 + lVar17);
                if ((cVar1 == *(char *)(lVar6 + -1 + lVar17)) &&
                   (cVar1 == *(char *)(lVar6 + lVar17))) {
                  iVar15 = (int)lVar17 + iVar3;
                  break;
                }
                lVar17 = lVar17 + 1;
              } while ((lVar14 - lVar5) + 1 != lVar17);
            }
            for (; iVar3 < iVar15; iVar3 = iVar3 + iVar11) {
              iVar11 = iVar15 - iVar3;
              if (0x7f < iVar11) {
                iVar11 = 0x80;
              }
              local_1b5 = (undefined1)iVar11;
              (*s->func)(s->context,&local_1b5,1);
              (*s->func)(s->context,(void *)((long)pvVar12 + (long)iVar3),iVar11);
              pvVar12 = local_198;
            }
            iVar11 = (int)local_180;
            if (iVar15 + 2 < iVar11) {
              lVar14 = (long)iVar15;
              iVar16 = iVar15 + 1;
              if (iVar15 + 1 < iVar11) {
                iVar16 = iVar11;
              }
              do {
                if (*(char *)((long)local_1a0 + lVar14) != *(char *)((long)pvVar12 + (long)iVar3)) {
                  iVar16 = (int)lVar14;
                  break;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 < (long)local_188);
              if (iVar3 < iVar16) {
                do {
                  iVar15 = iVar16 - iVar3;
                  if (0x7e < iVar16 - iVar3) {
                    iVar15 = 0x7f;
                  }
                  local_1b5 = *(undefined1 *)((long)pvVar12 + (long)iVar3);
                  local_1ad = (char)iVar15 + -0x80;
                  (*s->func)(s->context,&local_1ad,1);
                  (*s->func)(s->context,&local_1b5,1);
                  iVar3 = iVar3 + iVar15;
                  pvVar12 = local_198;
                } while (iVar3 < iVar16);
              }
            }
          } while (iVar3 < (int)local_180);
          lVar14 = local_190 + 1;
          local_1a8 = local_1a8 + local_188;
          pvVar4 = (void *)((long)local_1a0 + local_188);
          pvVar12 = local_118;
          uVar10 = local_164;
        } while (lVar14 != 4);
      }
      uVar7 = (int)local_140 + 1;
      uVar8 = (ulong)uVar7;
      pvVar4 = pvVar12;
    } while (uVar7 != local_168);
    free(pvVar12);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

#ifdef __STDC_WANT_SECURE_LIB__
      len = sprintf_s(buffer, sizeof(buffer), "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#else
      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#endif
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*x*(stbi__flip_vertically_on_write ? y-1-i : i));
      STBIW_FREE(scratch);
      return 1;
   }
}